

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_> *
__thiscall
array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::operator=
          (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
           *this,array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                 *other)

{
  int iVar1;
  CRuleCondition *pCVar2;
  CRuleCondition *pCVar3;
  array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_> *in_RSI;
  array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_> *in_RDI;
  int i;
  int in_stack_ffffffffffffffcc;
  array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
  *in_stack_ffffffffffffffd0;
  int local_14;
  
  size(in_RSI);
  set_size(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  local_14 = 0;
  while( true ) {
    iVar1 = size(in_RDI);
    if (iVar1 <= local_14) break;
    pCVar2 = operator[](in_RSI,local_14);
    pCVar3 = operator[](in_RDI,local_14);
    iVar1 = pCVar2->m_Y;
    pCVar3->m_X = pCVar2->m_X;
    pCVar3->m_Y = iVar1;
    pCVar3->m_Value = pCVar2->m_Value;
    local_14 = local_14 + 1;
  }
  return in_RDI;
}

Assistant:

array &operator = (const array &other)
	{
		set_size(other.size());
		for(int i = 0; i < size(); i++)
			(*this)[i] = other[i];
		return *this;
	}